

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_write_operators.hpp
# Opt level: O2

void __thiscall
duckdb::ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
          (ParquetUUIDOperator *this,ColumnWriterStatistics *stats_p,
          ParquetUUIDTargetType target_value)

{
  ParquetUUIDOperator *__s2;
  int iVar1;
  ParquetUUIDTargetType target_value_local;
  
  target_value_local.bytes._8_8_ = target_value.bytes._0_8_;
  __s2 = this + 9;
  target_value_local.bytes._0_8_ = stats_p;
  if (this[8] == (ParquetUUIDOperator)0x1) {
    iVar1 = switchD_015d2190::default(&target_value_local,__s2,0x10);
    if (iVar1 < 0) {
      *(undefined8 *)__s2 = target_value_local.bytes._0_8_;
      *(undefined8 *)(this + 0x11) = target_value_local.bytes._8_8_;
    }
    iVar1 = switchD_015d2190::default(&target_value_local,this + 0x19,0x10);
    if (iVar1 < 1) goto LAB_01f22abe;
  }
  else {
    *(ColumnWriterStatistics **)__s2 = stats_p;
    *(undefined8 *)(this + 0x11) = target_value_local.bytes._8_8_;
  }
  *(undefined8 *)(this + 0x19) = target_value_local.bytes._0_8_;
  *(undefined8 *)(this + 0x21) = target_value_local.bytes._8_8_;
LAB_01f22abe:
  this[8] = (ParquetUUIDOperator)0x1;
  return;
}

Assistant:

static void HandleStats(ColumnWriterStatistics *stats_p, TGT target_value) {
		auto &stats = stats_p->Cast<UUIDStatisticsState>();
		if (!stats.has_stats || memcmp(target_value.bytes, stats.min, ParquetUUIDTargetType::PARQUET_UUID_SIZE) < 0) {
			memcpy(stats.min, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		if (!stats.has_stats || memcmp(target_value.bytes, stats.max, ParquetUUIDTargetType::PARQUET_UUID_SIZE) > 0) {
			memcpy(stats.max, target_value.bytes, ParquetUUIDTargetType::PARQUET_UUID_SIZE);
		}
		stats.has_stats = true;
	}